

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O1

void __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator
          (SimpleFilteredSentenceBreakIterator *this,SimpleFilteredSentenceBreakIterator *other)

{
  int32_t *piVar1;
  SimpleFilteredSentenceBreakData *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  
  BreakIterator::BreakIterator(&this->super_BreakIterator,&other->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleFilteredSentenceBreakIterator_003ad968;
  pSVar2 = other->fData;
  piVar1 = &pSVar2->refcount;
  *piVar1 = *piVar1 + 1;
  this->fData = pSVar2;
  iVar3 = (*(((other->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr)->super_UObject).
            _vptr_UObject[4])();
  (this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr =
       (BreakIterator *)CONCAT44(extraout_var,iVar3);
  (this->fText).super_LocalPointerBase<UText>.ptr = (UText *)0x0;
  return;
}

Assistant:

SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator(const SimpleFilteredSentenceBreakIterator& other)
  : BreakIterator(other), fData(other.fData->incr()), fDelegate(other.fDelegate->clone())
{
}